

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O2

Result wabt::ApplyNames(Module *module)

{
  ExprVisitor *this;
  pointer ppFVar1;
  Func *this_00;
  pointer ppGVar2;
  pointer ppTVar3;
  Tag *pTVar4;
  pointer ppEVar5;
  Export *pEVar6;
  pointer ppEVar7;
  ElemSegment *pEVar8;
  pointer piVar9;
  pointer ppDVar10;
  DataSegment *pDVar11;
  pointer ppVVar12;
  Result RVar13;
  Index IVar14;
  reference base;
  VarExpr<(wabt::ExprType)36> *pVVar15;
  Enum EVar16;
  size_t i;
  ulong uVar17;
  size_t i_4;
  size_t i_3;
  intrusive_list<wabt::Expr> *this_01;
  NameApplier applier;
  
  this = &applier.visitor_;
  applier.super_DelegateNop.super_Delegate._vptr_Delegate = (Delegate)&PTR__NameApplier_00185390;
  applier.module_ = (Module *)0x0;
  applier.current_func_ = (Func *)0x0;
  ExprVisitor::ExprVisitor(this,(Delegate *)&applier);
  applier.labels_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  applier.labels_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  applier.param_and_local_index_to_name_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  applier.labels_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  applier.param_and_local_index_to_name_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  applier.param_and_local_index_to_name_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  applier.module_ = module;
  for (uVar17 = 0;
      ppFVar1 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
      uVar17 < (ulong)((long)(module->funcs).
                             super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl
                             .super__Vector_impl_data._M_finish - (long)ppFVar1 >> 3);
      uVar17 = uVar17 + 1) {
    this_00 = ppFVar1[uVar17];
    applier.current_func_ = this_00;
    if (((this_00->decl).has_func_type == true) &&
       (RVar13 = anon_unknown_13::NameApplier::UseNameForFuncTypeVar
                           (&applier,&(this_00->decl).type_var), RVar13.enum_ == Error))
    goto LAB_0011452e;
    IVar14 = Func::GetNumParamsAndLocals(this_00);
    MakeTypeBindingReverseMapping
              ((ulong)IVar14,&this_00->bindings,&applier.param_and_local_index_to_name_);
    RVar13 = ExprVisitor::VisitFunc(this,this_00);
    if (RVar13.enum_ == Error) goto LAB_0011452e;
    applier.current_func_ = (Func *)0x0;
  }
  uVar17 = 0;
  do {
    ppGVar2 = (module->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(module->globals).
                      super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppGVar2 >> 3) <= uVar17) {
      uVar17 = 0;
      goto LAB_00114556;
    }
    RVar13 = ExprVisitor::VisitExprList(this,&ppGVar2[uVar17]->init_expr);
    uVar17 = uVar17 + 1;
  } while (RVar13.enum_ != Error);
  goto LAB_0011452e;
LAB_00114556:
  ppTVar3 = (module->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((ulong)((long)(module->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3 >> 3) <= uVar17)
  goto LAB_0011458a;
  pTVar4 = ppTVar3[uVar17];
  if (((pTVar4->decl).has_func_type == true) &&
     (RVar13 = anon_unknown_13::NameApplier::UseNameForFuncTypeVar
                         (&applier,&(pTVar4->decl).type_var), RVar13.enum_ == Error))
  goto LAB_0011452e;
  uVar17 = uVar17 + 1;
  goto LAB_00114556;
LAB_0011458a:
  for (uVar17 = 0;
      ppEVar5 = (module->exports).
                super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      uVar17 < (ulong)((long)(module->exports).
                             super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar5 >> 3);
      uVar17 = uVar17 + 1) {
    pEVar6 = ppEVar5[uVar17];
    switch(pEVar6->kind) {
    case First:
      anon_unknown_13::NameApplier::UseNameForFuncVar(&applier,&pEVar6->var);
      break;
    case Table:
      anon_unknown_13::NameApplier::UseNameForTableVar(&applier,&pEVar6->var);
      break;
    case Memory:
      anon_unknown_13::NameApplier::UseNameForMemoryVar(&applier,&pEVar6->var);
      break;
    case Global:
      anon_unknown_13::NameApplier::UseNameForGlobalVar(&applier,&pEVar6->var);
      break;
    case Last:
      anon_unknown_13::NameApplier::UseNameForTagVar(&applier,&pEVar6->var);
    }
  }
  for (uVar17 = 0;
      ppEVar7 = (module->elem_segments).
                super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
      uVar17 < (ulong)((long)(module->elem_segments).
                             super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar7 >> 3);
      uVar17 = uVar17 + 1) {
    pEVar8 = ppEVar7[uVar17];
    RVar13 = anon_unknown_13::NameApplier::UseNameForTableVar(&applier,&pEVar8->table_var);
    if ((RVar13.enum_ == Error) ||
       (RVar13 = ExprVisitor::VisitExprList(this,&pEVar8->offset), RVar13.enum_ == Error))
    goto LAB_0011452e;
    piVar9 = *(pointer *)
              ((long)&(pEVar8->elem_exprs).
                      super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                      ._M_impl + 8);
    for (this_01 = (pEVar8->elem_exprs).
                   super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_01 != piVar9;
        this_01 = this_01 + 1) {
      base = intrusive_list<wabt::Expr>::front(this_01);
      if (base->type_ == RefFunc) {
        pVVar15 = cast<wabt::VarExpr<(wabt::ExprType)36>,wabt::Expr>(base);
        RVar13 = anon_unknown_13::NameApplier::UseNameForFuncVar(&applier,&pVVar15->var);
        if (RVar13.enum_ == Error) goto LAB_0011452e;
      }
    }
  }
  uVar17 = 0;
  do {
    ppDVar10 = (module->data_segments).
               super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    if ((ulong)((long)(module->data_segments).
                      super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppDVar10 >> 3) <= uVar17) {
      uVar17 = 0;
      goto LAB_0011470b;
    }
    pDVar11 = ppDVar10[uVar17];
    RVar13 = anon_unknown_13::NameApplier::UseNameForMemoryVar(&applier,&pDVar11->memory_var);
    if (RVar13.enum_ == Error) break;
    RVar13 = ExprVisitor::VisitExprList(this,&pDVar11->offset);
    uVar17 = uVar17 + 1;
  } while (RVar13.enum_ != Error);
  goto LAB_0011452e;
  while( true ) {
    RVar13 = anon_unknown_13::NameApplier::UseNameForFuncVar(&applier,ppVVar12[uVar17]);
    uVar17 = uVar17 + 1;
    if (RVar13.enum_ == Error) break;
LAB_0011470b:
    ppVVar12 = (module->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(module->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar12 >> 3) <= uVar17) {
      applier.module_ = (Module *)0x0;
      EVar16 = Ok;
      goto LAB_00114531;
    }
  }
LAB_0011452e:
  EVar16 = Error;
LAB_00114531:
  anon_unknown_13::NameApplier::~NameApplier(&applier);
  return (Result)EVar16;
}

Assistant:

Result ApplyNames(Module* module) {
  NameApplier applier;
  return applier.VisitModule(module);
}